

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_create(REF_CELL *ref_cell_ptr,REF_CELL_TYPE type)

{
  int iVar1;
  uint uVar2;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  undefined8 uVar4;
  REF_INT *pRVar5;
  long lVar6;
  char *pcVar7;
  
  *ref_cell_ptr = (REF_CELL)0x0;
  ref_cell = (REF_CELL)malloc(0x48);
  *ref_cell_ptr = ref_cell;
  if (ref_cell == (REF_CELL)0x0) {
    pcVar7 = "malloc *ref_cell_ptr of REF_CELL_STRUCT NULL";
    uVar4 = 0x1bb;
LAB_001125c7:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_create",pcVar7);
    uVar2 = 2;
  }
  else {
    uVar2 = ref_cell_initialize(ref_cell,type);
    if (uVar2 == 0) {
      ref_cell->n = 0;
      ref_cell->max = 100;
      uVar2 = ref_cell->size_per;
      if ((int)uVar2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x1c7,"ref_cell_create","malloc ref_cell->c2n of REF_INT negative");
        return 1;
      }
      pRVar3 = (REF_INT *)malloc((ulong)uVar2 * 400);
      ref_cell->c2n = pRVar3;
      if (pRVar3 == (REF_INT *)0x0) {
        pcVar7 = "malloc ref_cell->c2n of REF_INT NULL";
        uVar4 = 0x1c7;
        goto LAB_001125c7;
      }
      iVar1 = ref_cell->size_per;
      pRVar5 = pRVar3 + 1;
      lVar6 = -100;
      do {
        pRVar5[-1] = -1;
        *pRVar5 = (int)lVar6 + 0x65;
        pRVar5 = pRVar5 + iVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
      pRVar3[(ulong)(uVar2 * 99) + 1] = -1;
      ref_cell->blank = 0;
      uVar2 = ref_adj_create(&ref_cell->ref_adj);
      if (uVar2 == 0) {
        return 0;
      }
      pcVar7 = "create ref_adj for ref_cell";
      uVar4 = 0x1d0;
    }
    else {
      pcVar7 = "init";
      uVar4 = 0x1bf;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_create",(ulong)uVar2,pcVar7);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_create(REF_CELL *ref_cell_ptr, REF_CELL_TYPE type) {
  REF_INT cell;
  REF_INT max;
  REF_CELL ref_cell;

  (*ref_cell_ptr) = NULL;

  ref_malloc(*ref_cell_ptr, 1, REF_CELL_STRUCT);

  ref_cell = (*ref_cell_ptr);

  RSS(ref_cell_initialize(ref_cell, type), "init");

  max = 100;

  ref_cell_n(ref_cell) = 0;
  ref_cell_max(ref_cell) = max;

  ref_malloc(ref_cell->c2n,
             ref_cell_max(ref_cell) * ref_cell_size_per(ref_cell), REF_INT);

  for (cell = 0; cell < max; cell++) {
    ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
    ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
  }
  ref_cell_c2n(ref_cell, 1, max - 1) = REF_EMPTY;
  ref_cell_blank(ref_cell) = 0;

  RSS(ref_adj_create(&(ref_cell->ref_adj)), "create ref_adj for ref_cell");

  return REF_SUCCESS;
}